

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistrhoPlugin.cpp
# Opt level: O1

void __thiscall
DISTRHO::Plugin::initAudioPort(Plugin *this,bool input,uint32_t index,AudioPort *port)

{
  int __fd;
  int iVar1;
  int __fd_00;
  String local_40;
  
  if ((port->hints & 1) == 0) {
    __fd = 0x10d10d;
    if (input) {
      __fd = 0x10d100;
    }
    iVar1 = 0x10d11b;
    __fd_00 = 0x10d125;
  }
  else {
    __fd = 0x10d0e6;
    if (input) {
      __fd = 0x10d0dc;
    }
    iVar1 = 0x10d0f1;
    __fd_00 = 0x10d0f8;
  }
  if (input) {
    __fd_00 = iVar1;
  }
  String::_dup(&port->name,__fd);
  String::String(&local_40,index + 1,false);
  String::operator+=(&port->name,local_40.fBuffer);
  String::~String(&local_40);
  String::_dup(&port->symbol,__fd_00);
  String::String(&local_40,index + 1,false);
  String::operator+=(&port->symbol,local_40.fBuffer);
  String::~String(&local_40);
  return;
}

Assistant:

void Plugin::initAudioPort(bool input, uint32_t index, AudioPort& port)
{
    if (port.hints & kAudioPortIsCV)
    {
        port.name    = input ? "CV Input " : "CV Output ";
        port.name   += String(index+1);
        port.symbol  = input ? "cv_in_" : "cv_out_";
        port.symbol += String(index+1);
    }
    else
    {
        port.name    = input ? "Audio Input " : "Audio Output ";
        port.name   += String(index+1);
        port.symbol  = input ? "audio_in_" : "audio_out_";
        port.symbol += String(index+1);
    }
}